

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallGenerator::AddInstallRule
          (cmInstallGenerator *this,ostream *os,string *dest,cmInstallType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,bool optional,char *permissions_file,char *permissions_dir,char *rename,
          char *literal_args,Indent indent)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  pointer pbVar4;
  char *pcVar5;
  const_iterator fi;
  pointer pbVar6;
  string stype;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  if (type < (cmInstallType_DIRECTORY|cmInstallType_STATIC_LIBRARY)) {
    std::__cxx11::string::assign((char *)&local_50);
  }
  pcVar5 = (char *)(ulong)(uint)indent.Level;
  operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  bVar1 = cmsys::SystemTools::FileIsFullPath((dest->_M_dataplus)._M_p);
  if (bVar1) {
    std::operator<<(os,"list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n");
    poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar3," \"");
    for (pbVar6 = (files->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != (files->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      if (pbVar6 != (files->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) {
        std::operator<<(os,";");
      }
      poVar3 = std::operator<<(os,(string *)dest);
      std::operator<<(poVar3,"/");
      if ((rename == (char *)0x0) || (*rename == '\0')) {
        cmsys::SystemTools::GetFilenameName(&local_70,pbVar6);
        std::operator<<(os,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        std::operator<<(os,rename);
      }
    }
    std::operator<<(os,"\")\n");
    poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar3,"if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n");
    poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar3 = operator<<(poVar3,(cmScriptGeneratorIndent)indent.Level);
    poVar3 = std::operator<<(poVar3,"message(WARNING \"ABSOLUTE path INSTALL ");
    std::operator<<(poVar3,"DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n");
    poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar3,"endif()\n");
    poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar3,"if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n");
    poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar3 = operator<<(poVar3,(cmScriptGeneratorIndent)indent.Level);
    poVar3 = std::operator<<(poVar3,"message(FATAL_ERROR \"ABSOLUTE path INSTALL ");
    poVar3 = std::operator<<(poVar3,"DESTINATION forbidden (by caller): ");
    std::operator<<(poVar3,"${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n");
    poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    pcVar5 = "endif()\n";
    std::operator<<(poVar3,"endif()\n");
  }
  ConvertToAbsoluteDestination(&local_70,(cmInstallGenerator *)pcVar5,dest);
  poVar3 = std::operator<<(os,"file(INSTALL DESTINATION \"");
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"\" TYPE ");
  std::operator<<(poVar3,(string *)&local_50);
  if (optional) {
    std::operator<<(os," OPTIONAL");
  }
  uVar2 = this->Message - MessageAlways;
  if (uVar2 < 3) {
    std::operator<<(os,&DAT_00578044 + *(int *)(&DAT_00578044 + (ulong)uVar2 * 4));
  }
  if ((permissions_file != (char *)0x0) && (*permissions_file != '\0')) {
    poVar3 = std::operator<<(os," PERMISSIONS");
    std::operator<<(poVar3,permissions_file);
  }
  if ((permissions_dir != (char *)0x0) && (*permissions_dir != '\0')) {
    poVar3 = std::operator<<(os," DIR_PERMISSIONS");
    std::operator<<(poVar3,permissions_dir);
  }
  if ((rename != (char *)0x0) && (*rename != '\0')) {
    poVar3 = std::operator<<(os," RENAME \"");
    poVar3 = std::operator<<(poVar3,rename);
    std::operator<<(poVar3,"\"");
  }
  std::operator<<(os," FILES");
  pbVar6 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pbVar4 - (long)pbVar6 == 0x20) {
    poVar3 = std::operator<<(os," \"");
    poVar3 = std::operator<<(poVar3,(string *)
                                    (files->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
    pcVar5 = "\"";
LAB_004105a8:
    std::operator<<(poVar3,pcVar5);
    if ((literal_args == (char *)0x0) || (*literal_args == '\0')) goto LAB_004105d8;
  }
  else {
    for (; pbVar6 != pbVar4; pbVar6 = pbVar6 + 1) {
      poVar3 = std::operator<<(os,"\n");
      poVar3 = operator<<(poVar3,(cmScriptGeneratorIndent)indent.Level);
      poVar3 = std::operator<<(poVar3,"  \"");
      poVar3 = std::operator<<(poVar3,(string *)pbVar6);
      std::operator<<(poVar3,"\"");
      pbVar4 = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    poVar3 = std::operator<<(os,"\n");
    poVar3 = operator<<(poVar3,(cmScriptGeneratorIndent)indent.Level);
    pcVar5 = " ";
    std::operator<<(poVar3," ");
    poVar3 = os;
    if ((literal_args == (char *)0x0) || (*literal_args == '\0')) goto LAB_004105a8;
  }
  std::operator<<(os,literal_args);
LAB_004105d8:
  std::operator<<(os,")\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmInstallGenerator::AddInstallRule(
  std::ostream& os, std::string const& dest, cmInstallType type,
  std::vector<std::string> const& files, bool optional /* = false */,
  const char* permissions_file /* = 0 */,
  const char* permissions_dir /* = 0 */, const char* rename /* = 0 */,
  const char* literal_args /* = 0 */, Indent indent)
{
  // Use the FILE command to install the file.
  std::string stype;
  switch (type) {
    case cmInstallType_DIRECTORY:
      stype = "DIRECTORY";
      break;
    case cmInstallType_PROGRAMS:
      stype = "PROGRAM";
      break;
    case cmInstallType_EXECUTABLE:
      stype = "EXECUTABLE";
      break;
    case cmInstallType_STATIC_LIBRARY:
      stype = "STATIC_LIBRARY";
      break;
    case cmInstallType_SHARED_LIBRARY:
      stype = "SHARED_LIBRARY";
      break;
    case cmInstallType_MODULE_LIBRARY:
      stype = "MODULE";
      break;
    case cmInstallType_FILES:
      stype = "FILE";
      break;
  }
  os << indent;
  if (cmSystemTools::FileIsFullPath(dest.c_str())) {
    os << "list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n";
    os << indent << " \"";
    for (std::vector<std::string>::const_iterator fi = files.begin();
         fi != files.end(); ++fi) {
      if (fi != files.begin()) {
        os << ";";
      }
      os << dest << "/";
      if (rename && *rename) {
        os << rename;
      } else {
        os << cmSystemTools::GetFilenameName(*fi);
      }
    }
    os << "\")\n";
    os << indent << "if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
    os << indent << indent << "message(WARNING \"ABSOLUTE path INSTALL "
       << "DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
    os << indent << "endif()\n";

    os << indent << "if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
    os << indent << indent << "message(FATAL_ERROR \"ABSOLUTE path INSTALL "
       << "DESTINATION forbidden (by caller): "
       << "${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
    os << indent << "endif()\n";
  }
  std::string absDest = this->ConvertToAbsoluteDestination(dest);
  os << "file(INSTALL DESTINATION \"" << absDest << "\" TYPE " << stype;
  if (optional) {
    os << " OPTIONAL";
  }
  switch (this->Message) {
    case MessageDefault:
      break;
    case MessageAlways:
      os << " MESSAGE_ALWAYS";
      break;
    case MessageLazy:
      os << " MESSAGE_LAZY";
      break;
    case MessageNever:
      os << " MESSAGE_NEVER";
      break;
  }
  if (permissions_file && *permissions_file) {
    os << " PERMISSIONS" << permissions_file;
  }
  if (permissions_dir && *permissions_dir) {
    os << " DIR_PERMISSIONS" << permissions_dir;
  }
  if (rename && *rename) {
    os << " RENAME \"" << rename << "\"";
  }
  os << " FILES";
  if (files.size() == 1) {
    os << " \"" << files[0] << "\"";
  } else {
    for (std::vector<std::string>::const_iterator fi = files.begin();
         fi != files.end(); ++fi) {
      os << "\n" << indent << "  \"" << *fi << "\"";
    }
    os << "\n" << indent << " ";
    if (!(literal_args && *literal_args)) {
      os << " ";
    }
  }
  if (literal_args && *literal_args) {
    os << literal_args;
  }
  os << ")\n";
}